

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall t_st_generator::generate_const(t_st_generator *this,t_const *tconst)

{
  ostream *poVar1;
  string local_b8;
  string local_98;
  string local_78;
  t_const_value *local_48;
  t_const_value *value;
  string name;
  t_type *type;
  t_const *tconst_local;
  t_st_generator *this_local;
  
  name.field_2._8_8_ = t_const::get_type(tconst);
  t_const::get_name_abi_cxx11_((string *)&value,tconst);
  local_48 = t_const::get_value(tconst);
  class_name_abi_cxx11_(&local_98,this);
  prefix(&local_78,this,&local_98);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_78);
  poVar1 = std::operator<<(poVar1," constants at: \'");
  poVar1 = std::operator<<(poVar1,(string *)&value);
  poVar1 = std::operator<<(poVar1,"\' put: [");
  render_const_value_abi_cxx11_(&local_b8,this,(t_type *)name.field_2._8_8_,local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_b8);
  poVar1 = std::operator<<(poVar1,"]!");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void t_st_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_ << prefix(class_name()) << " constants at: '" << name << "' put: ["
     << render_const_value(type, value) << "]!" << endl << endl;
}